

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3ExprAffinity(Expr *pExpr)

{
  u8 uVar1;
  Expr *pEStack_18;
  int op;
  Expr *pExpr_local;
  
  pEStack_18 = pExpr;
  if ((pExpr->flags & 0x200) == 0) {
    for (; (pEStack_18->flags & 0x1000) != 0; pEStack_18 = pEStack_18->pLeft) {
    }
    uVar1 = pEStack_18->op;
    if (uVar1 == 0x83) {
      pExpr_local._7_1_ = sqlite3ExprAffinity(((pEStack_18->x).pSelect)->pEList->a[0].pExpr);
    }
    else {
      if (uVar1 == 0xa8) {
        uVar1 = pEStack_18->op2;
      }
      if (uVar1 == '$') {
        pExpr_local._7_1_ = sqlite3AffinityType((pEStack_18->u).zToken,(Column *)0x0);
      }
      else if (((uVar1 == 0xa4) || (uVar1 == 0xa2)) && ((pEStack_18->y).pTab != (Table *)0x0)) {
        pExpr_local._7_1_ =
             sqlite3TableColumnAffinity((pEStack_18->y).pTab,(int)pEStack_18->iColumn);
      }
      else if (uVar1 == 0xaa) {
        pExpr_local._7_1_ =
             sqlite3ExprAffinity(((pEStack_18->pLeft->x).pSelect)->pEList->a[pEStack_18->iColumn].
                                 pExpr);
      }
      else {
        pExpr_local._7_1_ = pEStack_18->affinity;
      }
    }
  }
  else {
    pExpr_local._7_1_ = '\0';
  }
  return pExpr_local._7_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  if( pExpr->flags & EP_Generic ) return 0;
  while( ExprHasProperty(pExpr, EP_Skip) ){
    assert( pExpr->op==TK_COLLATE );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->y.pTab ){
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}